

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.h
# Opt level: O2

StringToInt64Map * __thiscall
CoreML::Specification::CategoricalMapping::mutable_stringtoint64map(CategoricalMapping *this)

{
  StringToInt64Map *this_00;
  
  if (this->_oneof_case_[0] == 1) {
    this_00 = (this->MappingType_).stringtoint64map_;
  }
  else {
    clear_MappingType(this);
    this->_oneof_case_[0] = 1;
    this_00 = (StringToInt64Map *)operator_new(0x38);
    StringToInt64Map::StringToInt64Map(this_00);
    (this->MappingType_).stringtoint64map_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::StringToInt64Map* CategoricalMapping::mutable_stringtoint64map() {
  if (!has_stringtoint64map()) {
    clear_MappingType();
    set_has_stringtoint64map();
    MappingType_.stringtoint64map_ = new ::CoreML::Specification::StringToInt64Map;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CategoricalMapping.stringToInt64Map)
  return MappingType_.stringtoint64map_;
}